

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::endPass(Renderer *this)

{
  element_type *this_00;
  Renderer *this_local;
  
  (*glad_glPolygonMode)(0x408,0x1b02);
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glDisable)(0xb71);
  this_00 = std::__shared_ptr_access<Shader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Shader,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &(this->_screenbuffer).shader);
  Shader::use(this_00);
  (*glad_glBindVertexArray)((this->_screenbuffer).VAO);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->_screenbuffer).texture);
  (*glad_glDrawArrays)(4,0,6);
  return;
}

Assistant:

void Renderer::endPass() const
{
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glDisable(GL_DEPTH_TEST);

    // Screenbuffer step
    _screenbuffer.shader->use();
    glBindVertexArray(_screenbuffer.VAO);
    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, _screenbuffer.texture);
    glDrawArrays(GL_TRIANGLES, 0, 6);
}